

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::printDisplayLine(HighsMipSolverData *this,int solution_source)

{
  long lVar1;
  HighsLogOptions *pHVar2;
  byte bVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  char *pcVar6;
  undefined8 uVar7;
  size_type __maxlen;
  HighsMipSolverData *this_00;
  pointer pvVar8;
  pointer pvVar9;
  double *mip_rel_gap_00;
  double *primal_bound_00;
  double *dual_bound_00;
  size_t in_RCX;
  void *in_RDX;
  int in_ESI;
  long *in_RDI;
  double extraout_XMM0_Qa;
  double dVar10;
  bool interrupt;
  double mip_rel_gap;
  double primal_bound;
  double dual_bound;
  array<char,_22UL> lb_string_1;
  array<char,_22UL> ub_string_1;
  array<char,_22UL> lb_string;
  array<char,_22UL> ub_string;
  array<char,_22UL> gap_string;
  HighsInt dynamic_constraints_in_lp;
  array<char,_22UL> print_lp_iters;
  double gap;
  double ub;
  double lb;
  double explored;
  array<char,_22UL> print_leaves;
  array<char,_22UL> queue_nodes;
  array<char,_22UL> print_nodes;
  string work_string1;
  string work_string0;
  string time_string;
  bool timeless_log;
  bool output_flag;
  HighsCutPool *in_stack_fffffffffffffbe0;
  double *in_stack_fffffffffffffbf0;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  double in_stack_fffffffffffffc08;
  HighsMipSolverData *in_stack_fffffffffffffc10;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  string *message;
  char *in_stack_fffffffffffffc38;
  char *trailingStr;
  undefined4 in_stack_fffffffffffffc40;
  HighsInt in_stack_fffffffffffffc44;
  HighsMipSolverData *in_stack_fffffffffffffc48;
  int local_300;
  undefined8 in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  double local_2a0;
  undefined1 local_289 [40];
  byte local_261;
  double local_260;
  string local_248 [54];
  undefined8 local_212;
  undefined8 local_20a;
  undefined4 local_202;
  undefined2 local_1fe;
  undefined8 local_1fc;
  undefined8 local_1f4;
  undefined4 local_1ec;
  undefined2 local_1e8;
  undefined8 local_1e6;
  undefined8 local_1de;
  undefined4 local_1d6;
  undefined2 local_1d2;
  string local_1d0 [60];
  undefined8 local_194;
  undefined8 local_18c;
  undefined4 local_184;
  undefined2 local_180;
  undefined8 local_17e;
  undefined8 local_176;
  undefined4 local_16e;
  undefined2 local_16a;
  undefined8 local_168;
  undefined8 local_160;
  undefined4 local_158;
  undefined2 local_154;
  array<char,_22UL> local_152;
  int local_13c;
  double local_120;
  double local_118;
  HighsLogOptions *local_108;
  HighsMipSolverData *in_stack_ffffffffffffff40;
  string local_b8 [39];
  allocator local_91;
  string local_90 [54];
  byte local_5a;
  allocator local_59;
  string local_58 [34];
  byte local_36;
  byte local_35;
  int local_34;
  
  trailingStr = &stack0xfffffffffffffbd8;
  local_35 = **(byte **)(*(long *)(*in_RDI + 8) + 0x388) & 1;
  if (local_35 != 0) {
    local_36 = *(byte *)(*(long *)(*in_RDI + 8) + 0x1da) & 1;
    local_34 = in_ESI;
    if (local_36 == 0) {
      HighsTimer::read((HighsTimer *)(*in_RDI + 0x168),0,in_RDX,in_RCX);
      local_2a0 = extraout_XMM0_Qa;
    }
    else {
      local_2a0 = (double)in_RDI[0xce3] + 1.0;
    }
    in_RDI[0xce3] = (long)local_2a0;
    if ((local_34 != -1) ||
       (*(double *)(*(long *)(*in_RDI + 8) + 0x348) <= (double)in_RDI[0xce3] - (double)in_RDI[0xce4]
       )) {
      in_RDI[0xce4] = in_RDI[0xce3];
      local_5a = 0;
      if ((local_36 & 1) == 0) {
        highsFormatToString_abi_cxx11_((char *)in_RDI[0xce3],local_58," %7.1fs");
      }
      else {
        std::allocator<char>::allocator();
        local_5a = 1;
        std::__cxx11::string::string(local_58,"",&local_59);
      }
      if ((local_5a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      if (in_RDI[0xcf5] % 0x14 == 0) {
        if (in_RDI[0xcf5] == 0) {
          printSolutionSourceKey(in_stack_ffffffffffffff40);
        }
        pcVar6 = "      Work      ";
        if ((local_36 & 1) != 0) {
          pcVar6 = "   Work";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_90,pcVar6,&local_91);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        in_stack_fffffffffffffd38 = "LpIters     Time";
        if ((local_36 & 1) != 0) {
          in_stack_fffffffffffffd38 = "LpIters";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_b8,in_stack_fffffffffffffd38,(allocator *)&stack0xffffffffffffff47);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
        lVar1 = *(long *)(*in_RDI + 8);
        in_stack_fffffffffffffd30 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        highsLogUser((HighsLogOptions *)(lVar1 + 0x380),kInfo,
                     "\n        Nodes      |    B&B Tree     |            Objective Bounds              |  Dynamic Constraints | %s\nSrc  Proc. InQueue |  Leaves   Expl. | BestBound       BestSol              Gap |   Cuts   InLp Confl. | %s\n\n"
                     ,in_stack_fffffffffffffd30,uVar7);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_90);
      }
      in_RDI[0xcf5] = in_RDI[0xcf5] + 1;
      convertToPrintString(CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      HighsNodeQueue::numActiveNodes((HighsNodeQueue *)in_stack_fffffffffffffbe0);
      convertToPrintString(CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      convertToPrintString(CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      dVar10 = HighsCDouble::operator_cast_to_double((HighsCDouble *)(in_RDI + 0xce0));
      local_108 = (HighsLogOptions *)(dVar10 * 100.0);
      local_120 = limitsToGap(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                              (double)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00),
                              (double *)
                              CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                              in_stack_fffffffffffffbf0);
      uVar11 = (undefined4)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
      local_120 = local_120 * 100.0;
      if (*(double *)(*(long *)(*in_RDI + 8) + 0x140) < local_118) {
        local_118 = *(double *)(*(long *)(*in_RDI + 8) + 0x140);
      }
      convertToPrintString(CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      HVar4 = HighsLpRelaxation::numRows((HighsLpRelaxation *)0x629572);
      if (HVar4 < 1) {
        local_300 = 0;
      }
      else {
        HVar4 = HighsLpRelaxation::numRows((HighsLpRelaxation *)0x62959b);
        HVar5 = HighsLpRelaxation::getNumModelRows((HighsLpRelaxation *)0x6295b8);
        local_300 = HVar4 - HVar5;
      }
      local_13c = local_300;
      if (((double)in_RDI[0xcf8] != INFINITY) || (NAN((double)in_RDI[0xcf8]))) {
        memset(&local_152,0,0x16);
        if (local_120 < 9999.0) {
          pvVar8 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62966e);
          __maxlen = std::array<char,_22UL>::size(&local_152);
          snprintf(pvVar8,__maxlen,"%.2f%%",local_120);
          trailingStr = in_stack_fffffffffffffc38;
        }
        else {
          pvVar8 = std::array<char,_22UL>::data((array<char,_22UL> *)0x629650);
          strcpy(pvVar8,"Large");
          trailingStr = in_stack_fffffffffffffc38;
        }
        if (local_118 <= *(double *)(*(long *)(*in_RDI + 8) + 0x140)) {
          convertToPrintString
                    ((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     trailingStr);
          local_168 = local_194;
          local_160 = local_18c;
          local_158 = local_184;
          local_154 = local_180;
        }
        else {
          convertToPrintString
                    ((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     trailingStr);
          local_168 = local_17e;
          local_160 = local_176;
          local_158 = local_16e;
          local_154 = local_16a;
        }
        convertToPrintString
                  ((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),trailingStr
                  );
        lVar1 = *(long *)(*in_RDI + 8);
        solutionSourceToString_abi_cxx11_
                  ((HighsMipSolverData *)in_stack_fffffffffffffd38,
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd30 >> 0x18,0));
        uVar7 = std::__cxx11::string::c_str();
        pvVar8 = std::array<char,_22UL>::data((array<char,_22UL> *)0x629851);
        pvVar9 = std::array<char,_22UL>::data((array<char,_22UL> *)0x629866);
        mip_rel_gap_00 = (double *)std::array<char,_22UL>::data((array<char,_22UL> *)0x62987b);
        pHVar2 = local_108;
        primal_bound_00 = (double *)std::array<char,_22UL>::data((array<char,_22UL> *)0x6298a2);
        dual_bound_00 = (double *)std::array<char,_22UL>::data((array<char,_22UL> *)0x6298b7);
        this_00 = (HighsMipSolverData *)std::array<char,_22UL>::data((array<char,_22UL> *)0x6298cc);
        HighsCutPool::getNumCuts(in_stack_fffffffffffffbe0);
        HighsConflictPool::getNumConflicts((HighsConflictPool *)in_stack_fffffffffffffbe0);
        std::array<char,_22UL>::data((array<char,_22UL> *)0x62993c);
        std::__cxx11::string::c_str();
        highsLogUser(pHVar2,(HighsLogType)(lVar1 + 0x380),(char *)0x1,
                     " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8s   %6d %6d %6d   %7s%s\n",uVar7,
                     pvVar8,pvVar9);
        std::__cxx11::string::~string(local_1d0);
      }
      else {
        if (local_118 <= *(double *)(*(long *)(*in_RDI + 8) + 0x140)) {
          convertToPrintString
                    ((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     in_stack_fffffffffffffc38);
          local_1e6 = local_212;
          local_1de = local_20a;
          local_1d6 = local_202;
          local_1d2 = local_1fe;
        }
        else {
          convertToPrintString
                    ((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     in_stack_fffffffffffffc38);
          local_1e6 = local_1fc;
          local_1de = local_1f4;
          local_1d6 = local_1ec;
          local_1d2 = local_1e8;
        }
        convertToPrintString
                  ((double)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   in_stack_fffffffffffffc38);
        lVar1 = *(long *)(*in_RDI + 8);
        solutionSourceToString_abi_cxx11_
                  ((HighsMipSolverData *)in_stack_fffffffffffffd38,
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffd30 >> 0x18,0));
        in_stack_fffffffffffffc48 = (HighsMipSolverData *)std::__cxx11::string::c_str();
        pvVar8 = std::array<char,_22UL>::data((array<char,_22UL> *)0x629bba);
        pvVar9 = std::array<char,_22UL>::data((array<char,_22UL> *)0x629bcc);
        mip_rel_gap_00 = (double *)std::array<char,_22UL>::data((array<char,_22UL> *)0x629be1);
        pHVar2 = local_108;
        primal_bound_00 = (double *)std::array<char,_22UL>::data((array<char,_22UL> *)0x629c08);
        dual_bound_00 = (double *)std::array<char,_22UL>::data((array<char,_22UL> *)0x629c1d);
        dVar10 = local_120;
        HVar4 = HighsCutPool::getNumCuts(in_stack_fffffffffffffbe0);
        in_stack_fffffffffffffc44 =
             HighsConflictPool::getNumConflicts((HighsConflictPool *)in_stack_fffffffffffffbe0);
        std::array<char,_22UL>::data((array<char,_22UL> *)0x629c8b);
        std::__cxx11::string::c_str();
        this_00 = (HighsMipSolverData *)CONCAT44(uVar11,HVar4);
        highsLogUser(pHVar2,(HighsLogType)dVar10,(char *)(lVar1 + 0x380),1,
                     " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8.2f   %6d %6d %6d   %7s%s\n",
                     in_stack_fffffffffffffc48,pvVar8,pvVar9);
        std::__cxx11::string::~string(local_248);
      }
      limitsToBounds(this_00,dual_bound_00,primal_bound_00,mip_rel_gap_00);
      local_260 = local_260 * 100.0;
      HighsCallback::clearHighsCallbackDataOut(*(HighsCallback **)*in_RDI);
      message = (string *)local_289;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_289 + 1),"MIP logging",(allocator *)message);
      bVar3 = interruptFromCallbackWithData
                        (in_stack_fffffffffffffc48,in_stack_fffffffffffffc44,(double)trailingStr,
                         message);
      std::__cxx11::string::~string((string *)(local_289 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_289);
      local_261 = bVar3 & 1;
      std::__cxx11::string::~string(local_58);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::printDisplayLine(const int solution_source) {
  // MIP logging method
  //
  // Note that if the original problem is a maximization, the cost
  // coefficients are negated so that the MIP solver only solves a
  // minimization. Hence, in preparing to print the display line, the
  // dual bound (lb) is always less than the primal bound (ub). When
  // printed, the sense of the optimization is applied so that the
  // values printed correspond to the original objective.

  // No point in computing all the logging values if logging is off
  bool output_flag = *mipsolver.options_mip_->log_options.output_flag;
  if (!output_flag) return;

  bool timeless_log = mipsolver.options_mip_->timeless_log;
  disptime = timeless_log ? disptime + 1 : mipsolver.timer_.read();
  if (solution_source == kSolutionSourceNone &&
      disptime - last_disptime <
          mipsolver.options_mip_->mip_min_logging_interval)
    return;
  last_disptime = disptime;
  std::string time_string =
      timeless_log ? "" : highsFormatToString(" %7.1fs", disptime);

  if (num_disp_lines % 20 == 0) {
    if (num_disp_lines == 0) printSolutionSourceKey();
    std::string work_string0 = timeless_log ? "   Work" : "      Work      ";
    std::string work_string1 = timeless_log ? "LpIters" : "LpIters     Time";
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 // clang-format off
	"\n        Nodes      |    B&B Tree     |            Objective Bounds              |  Dynamic Constraints | %s\n"
	  "Src  Proc. InQueue |  Leaves   Expl. | BestBound       BestSol              Gap |   Cuts   InLp Confl. | %s\n\n",
                 // clang-format on
                 work_string0.c_str(), work_string1.c_str());

    //"   %7s | %10s | %10s | %10s | %10s | %-15s | %-15s | %7s | %7s "
    //"| %8s | %8s\n",
    //"time", "open nodes", "nodes", "leaves", "lpiters", "dual bound",
    //"primal bound", "cutpool", "confl.", "gap", "explored");
  }

  ++num_disp_lines;

  auto print_nodes = convertToPrintString(num_nodes);
  auto queue_nodes = convertToPrintString(nodequeue.numActiveNodes());
  auto print_leaves = convertToPrintString(num_leaves - num_leaves_before_run);

  double explored = 100 * double(pruned_treeweight);

  double lb;
  double ub;
  double gap = limitsToGap(lower_bound, upper_bound, lb, ub);
  gap *= 1e2;
  if (mipsolver.options_mip_->objective_bound < ub)
    ub = mipsolver.options_mip_->objective_bound;

  auto print_lp_iters = convertToPrintString(total_lp_iterations);
  HighsInt dynamic_constraints_in_lp =
      lp.numRows() > 0 ? lp.numRows() - lp.getNumModelRows() : 0;
  if (upper_bound != kHighsInf) {
    std::array<char, 22> gap_string = {};
    if (gap >= 9999.)
      std::strcpy(gap_string.data(), "Large");
    else
      std::snprintf(gap_string.data(), gap_string.size(), "%.2f%%", gap);

    std::array<char, 22> ub_string;
    if (mipsolver.options_mip_->objective_bound < ub) {
      ub_string =
          convertToPrintString((int)mipsolver.orig_model_->sense_ * ub, "*");
    } else
      ub_string = convertToPrintString((int)mipsolver.orig_model_->sense_ * ub);

    auto lb_string =
        convertToPrintString((int)mipsolver.orig_model_->sense_ * lb);

    highsLogUser(
        mipsolver.options_mip_->log_options, HighsLogType::kInfo,
        // clang-format off
                 " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8s   %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT "   %7s%s\n",
        // clang-format on
        solutionSourceToString(solution_source).c_str(), print_nodes.data(),
        queue_nodes.data(), print_leaves.data(), explored, lb_string.data(),
        ub_string.data(), gap_string.data(), cutpool.getNumCuts(),
        dynamic_constraints_in_lp, conflictPool.getNumConflicts(),
        print_lp_iters.data(), time_string.c_str());
  } else {
    std::array<char, 22> ub_string;
    if (mipsolver.options_mip_->objective_bound < ub) {
      ub_string =
          convertToPrintString((int)mipsolver.orig_model_->sense_ * ub, "*");
    } else
      ub_string = convertToPrintString((int)mipsolver.orig_model_->sense_ * ub);

    auto lb_string =
        convertToPrintString((int)mipsolver.orig_model_->sense_ * lb);

    highsLogUser(
        mipsolver.options_mip_->log_options, HighsLogType::kInfo,
        // clang-format off
        " %s %7s %7s   %7s %6.2f%%   %-15s %-15s %8.2f   %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT " %6" HIGHSINT_FORMAT "   %7s%s\n",
        // clang-format on
        solutionSourceToString(solution_source).c_str(), print_nodes.data(),
        queue_nodes.data(), print_leaves.data(), explored, lb_string.data(),
        ub_string.data(), gap, cutpool.getNumCuts(), dynamic_constraints_in_lp,
        conflictPool.getNumConflicts(), print_lp_iters.data(),
        time_string.c_str());
  }
  // Check that limitsToBounds yields the same values for the
  // dual_bound, primal_bound (modulo optimization sense) and
  // mip_rel_gap
  double dual_bound;
  double primal_bound;
  double mip_rel_gap;
  limitsToBounds(dual_bound, primal_bound, mip_rel_gap);
  mip_rel_gap *= 1e2;
  assert(dual_bound == (int)mipsolver.orig_model_->sense_ * lb);
  assert(primal_bound == (int)mipsolver.orig_model_->sense_ * ub);
  assert(gap == mip_rel_gap);

  // Possibly interrupt from MIP logging callback
  mipsolver.callback_->clearHighsCallbackDataOut();
  const bool interrupt = interruptFromCallbackWithData(
      kCallbackMipLogging, mipsolver.solution_objective_, "MIP logging");
  assert(!interrupt);
}